

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_shexp.hpp
# Opt level: O2

SH<15> * log_visibility(SH<15> *__return_storage_ptr__,vec3f cluster_center,
                       vector<Sphere,_std::allocator<Sphere>_> *blockers)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer pSVar3;
  undefined8 uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  istream *piVar8;
  undefined8 *puVar9;
  int i_1;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int i;
  pointer pSVar14;
  long lVar15;
  bool bVar16;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar17;
  float fVar18;
  vec3f w;
  float local_3368;
  long local_3350;
  vec3f local_3348;
  string filename;
  float fStack_3310;
  float local_330c;
  float fStack_3308;
  SymmSH<15> symmlog;
  _Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_> local_32b0;
  float local_3298 [2];
  float afStack_3290 [2];
  float local_3288 [2];
  float afStack_3280 [2];
  float local_3278 [2];
  float fStack_3270;
  float fStack_326c;
  float fStack_3268;
  float afStack_3264 [3];
  undefined1 local_3258 [16];
  undefined1 local_3248 [32];
  float local_3228 [2];
  float fStack_3220;
  float fStack_321c;
  float fStack_3218;
  float afStack_3214 [119];
  float magn [1024];
  float b [1024];
  float a [1024];
  
  local_3258._8_4_ = in_XMM0_Dc;
  local_3258._0_8_ = cluster_center._0_8_;
  local_3258._12_4_ = in_XMM0_Dd;
  if ((log_visibility(vec3f,std::vector<Sphere,std::allocator<Sphere>>)::init == '\0') &&
     (iVar6 = __cxa_guard_acquire(&log_visibility(vec3f,std::vector<Sphere,std::allocator<Sphere>>)
                                   ::init), iVar6 != 0)) {
    github111116::ConsoleLogger::log<char[30]>
              (&console,(char (*) [30])"loading log & OL lut (CPU)...");
    std::__cxx11::to_string((string *)local_3248,0xf);
    std::operator+(&filename,"../lut/lut",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3248);
    std::__cxx11::string::~string((string *)local_3248);
    std::ifstream::ifstream(local_3248,(string *)&filename,_S_in);
    if ((*(byte *)((long)local_3228 + *(long *)(local_3248._0_8_ + -0x18)) & 5) != 0) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar9 = "cannot open lut";
      __cxa_throw(puVar9,&char_const*::typeinfo,0);
    }
    local_3350 = 0;
    for (lVar7 = 0; lVar10 = (anonymous_namespace)::b_lut, lVar15 = (anonymous_namespace)::a_lut,
        lVar7 != 0x400; lVar7 = lVar7 + 1) {
      local_3368 = 0.0;
      lVar10 = 0;
      lVar15 = local_3350;
      while (lVar10 != -0xf) {
        std::istream::_M_extract<float>((float *)local_3248);
        bVar16 = lVar10 != 0;
        lVar10 = lVar10 + -1;
        if (bVar16) {
          local_3368 = local_3368 +
                       *(float *)((anonymous_namespace)::log_lut + lVar15) *
                       *(float *)((anonymous_namespace)::log_lut + lVar15);
        }
        lVar15 = lVar15 + 4;
      }
      if (local_3368 < 0.0) {
        local_3368 = sqrtf(local_3368);
      }
      else {
        local_3368 = SQRT(local_3368);
      }
      magn[lVar7] = local_3368;
      piVar8 = std::istream::_M_extract<float>((float *)local_3248);
      std::istream::_M_extract<float>((float *)piVar8);
      local_3350 = local_3350 + 0x3c;
    }
    fVar17 = 0.0;
    for (lVar7 = 0; lVar7 != 0x400; lVar7 = lVar7 + 1) {
      fVar18 = magn[lVar7];
      if (magn[lVar7] <= fVar17) {
        fVar18 = fVar17;
      }
      fVar17 = fVar18;
    }
    iVar6 = 0;
    (anonymous_namespace)::max_magn = fVar17;
    for (lVar7 = 0; lVar7 != 0x400; lVar7 = lVar7 + 1) {
      fVar18 = (float)(int)lVar7 / 1023.0;
      fVar18 = fVar18 * fVar17 + (1.0 - fVar18) * magn[0];
      lVar13 = (long)iVar6;
      iVar12 = 0x3ff;
      if (0x3ff < iVar6) {
        iVar12 = iVar6;
      }
      iVar11 = iVar6 + -1;
      do {
        iVar6 = iVar12;
        if (0x3fe < lVar13) break;
        iVar6 = iVar11 + 1;
        lVar5 = lVar13 + 1;
        lVar13 = lVar13 + 1;
        iVar11 = iVar6;
      } while (magn[lVar5] <= fVar18 && fVar18 != magn[lVar5]);
      fVar18 = (fVar18 - magn[iVar6]) / (magn[(long)iVar6 + 1] - magn[iVar6]);
      *(float *)(lVar15 + lVar7 * 4) = a[iVar6] * (1.0 - fVar18) + a[(long)iVar6 + 1] * fVar18;
      *(float *)(lVar10 + lVar7 * 4) = (1.0 - fVar18) * b[iVar6] + fVar18 * b[(long)iVar6 + 1];
    }
    std::ifstream::~ifstream(local_3248);
    std::__cxx11::string::~string((string *)&filename);
    __cxa_guard_release(&log_visibility(vec3f,std::vector<Sphere,std::allocator<Sphere>>)::init);
  }
  memset(__return_storage_ptr__,0,900);
  pSVar3 = (blockers->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar14 = (blockers->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
                 super__Vector_impl_data._M_start; pSVar14 != pSVar3; pSVar14 = pSVar14 + 1) {
    uVar1 = (pSVar14->center).x;
    uVar2 = (pSVar14->center).y;
    fVar17 = (float)uVar1 - (float)local_3258._0_4_;
    fVar18 = (float)uVar2 - (float)local_3258._4_4_;
    local_3348.z = (pSVar14->center).z - cluster_center.z;
    local_3348.y = fVar18;
    local_3348.x = fVar17;
    fVar18 = pSVar14->radius / SQRT(local_3348.z * local_3348.z + fVar17 * fVar17 + fVar18 * fVar18)
    ;
    fVar17 = 1.0;
    if (fVar18 <= 1.0) {
      fVar17 = fVar18;
    }
    fVar17 = asinf(fVar17);
    std::vector<SymmSH<15>,_std::allocator<SymmSH<15>_>_>::vector
              ((vector<SymmSH<15>,_std::allocator<SymmSH<15>_>_> *)&local_32b0,
               (vector<SymmSH<15>,_std::allocator<SymmSH<15>_>_> *)&(anonymous_namespace)::log_lut);
    fVar18 = (float)(((long)local_32b0._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_32b0._M_impl.super__Vector_impl_data._M_start) / 0x3c - 1);
    fVar17 = (fVar17 / (PI * 0.5)) * fVar18;
    if (fVar17 <= 0.0) {
      symmlog.a[0] = (local_32b0._M_impl.super__Vector_impl_data._M_start)->a[0];
      symmlog.a[1] = (local_32b0._M_impl.super__Vector_impl_data._M_start)->a[1];
      symmlog.a[2] = (local_32b0._M_impl.super__Vector_impl_data._M_start)->a[2];
      symmlog.a[3] = (local_32b0._M_impl.super__Vector_impl_data._M_start)->a[3];
      symmlog.a[4] = (local_32b0._M_impl.super__Vector_impl_data._M_start)->a[4];
      symmlog.a[5] = (local_32b0._M_impl.super__Vector_impl_data._M_start)->a[5];
      symmlog.a[6] = (local_32b0._M_impl.super__Vector_impl_data._M_start)->a[6];
      symmlog.a[7] = (local_32b0._M_impl.super__Vector_impl_data._M_start)->a[7];
      symmlog.a[8] = (local_32b0._M_impl.super__Vector_impl_data._M_start)->a[8];
      symmlog.a[9] = (local_32b0._M_impl.super__Vector_impl_data._M_start)->a[9];
      symmlog.a[10] = (local_32b0._M_impl.super__Vector_impl_data._M_start)->a[10];
      symmlog.a[0xb] = (local_32b0._M_impl.super__Vector_impl_data._M_start)->a[0xb];
      symmlog.a[0xc] = (local_32b0._M_impl.super__Vector_impl_data._M_start)->a[0xc];
      symmlog.a[0xd] = (local_32b0._M_impl.super__Vector_impl_data._M_start)->a[0xd];
      symmlog.a[0xe] = (local_32b0._M_impl.super__Vector_impl_data._M_start)->a[0xe];
    }
    else if (fVar18 <= fVar17) {
      symmlog.a[0] = local_32b0._M_impl.super__Vector_impl_data._M_finish[-1].a[0];
      symmlog.a[1] = local_32b0._M_impl.super__Vector_impl_data._M_finish[-1].a[1];
      symmlog.a[2] = local_32b0._M_impl.super__Vector_impl_data._M_finish[-1].a[2];
      symmlog.a[3] = local_32b0._M_impl.super__Vector_impl_data._M_finish[-1].a[3];
      symmlog.a[4] = local_32b0._M_impl.super__Vector_impl_data._M_finish[-1].a[4];
      symmlog.a[5] = local_32b0._M_impl.super__Vector_impl_data._M_finish[-1].a[5];
      symmlog.a[6] = local_32b0._M_impl.super__Vector_impl_data._M_finish[-1].a[6];
      symmlog.a[7] = local_32b0._M_impl.super__Vector_impl_data._M_finish[-1].a[7];
      symmlog.a[8] = local_32b0._M_impl.super__Vector_impl_data._M_finish[-1].a[8];
      symmlog.a[9] = local_32b0._M_impl.super__Vector_impl_data._M_finish[-1].a[9];
      symmlog.a[10] = local_32b0._M_impl.super__Vector_impl_data._M_finish[-1].a[10];
      symmlog.a[0xb] = local_32b0._M_impl.super__Vector_impl_data._M_finish[-1].a[0xb];
      symmlog.a[0xc] = local_32b0._M_impl.super__Vector_impl_data._M_finish[-1].a[0xc];
      symmlog.a[0xd] = local_32b0._M_impl.super__Vector_impl_data._M_finish[-1].a[0xd];
      symmlog.a[0xe] = local_32b0._M_impl.super__Vector_impl_data._M_finish[-1].a[0xe];
    }
    else {
      lVar7 = (long)(int)fVar17;
      filename._M_dataplus._M_p =
           *(pointer *)local_32b0._M_impl.super__Vector_impl_data._M_start[lVar7].a;
      filename._M_string_length =
           *(size_type *)(local_32b0._M_impl.super__Vector_impl_data._M_start[lVar7].a + 2);
      filename.field_2._M_allocated_capacity =
           *(undefined8 *)(local_32b0._M_impl.super__Vector_impl_data._M_start[lVar7].a + 4);
      filename.field_2._8_8_ =
           *(undefined8 *)(local_32b0._M_impl.super__Vector_impl_data._M_start[lVar7].a + 4 + 2);
      local_3228 = *(float (*) [2])
                    (local_32b0._M_impl.super__Vector_impl_data._M_start[lVar7].a + 8);
      uVar4 = *(undefined8 *)(local_32b0._M_impl.super__Vector_impl_data._M_start[lVar7].a + 8 + 2);
      afStack_3214._0_8_ =
           *(undefined8 *)(local_32b0._M_impl.super__Vector_impl_data._M_start[lVar7].a + 0xb + 2);
      fStack_3308 = (float)((ulong)*(undefined8 *)
                                    (local_32b0._M_impl.super__Vector_impl_data._M_start[lVar7].a +
                                    0xb) >> 0x20);
      fStack_3310 = (float)uVar4;
      local_330c = (float)((ulong)uVar4 >> 0x20);
      local_3298 = *(float (*) [2])local_32b0._M_impl.super__Vector_impl_data._M_start[lVar7 + 1].a;
      afStack_3290 = *(float (*) [2])
                      (local_32b0._M_impl.super__Vector_impl_data._M_start[lVar7 + 1].a + 2);
      local_3288 = *(float (*) [2])
                    (local_32b0._M_impl.super__Vector_impl_data._M_start[lVar7 + 1].a + 4);
      afStack_3280 = *(float (*) [2])
                      (local_32b0._M_impl.super__Vector_impl_data._M_start[lVar7 + 1].a + 4 + 2);
      local_3278 = *(float (*) [2])
                    (local_32b0._M_impl.super__Vector_impl_data._M_start[lVar7 + 1].a + 8);
      uVar4 = *(undefined8 *)
               (local_32b0._M_impl.super__Vector_impl_data._M_start[lVar7 + 1].a + 0xb);
      afStack_3264._0_8_ =
           *(undefined8 *)
            (local_32b0._M_impl.super__Vector_impl_data._M_start[lVar7 + 1].a + 0xb + 2);
      fStack_3270 = (float)*(undefined8 *)
                            (local_32b0._M_impl.super__Vector_impl_data._M_start[lVar7 + 1].a + 8 +
                            2);
      fStack_326c = (float)uVar4;
      fStack_3268 = (float)((ulong)uVar4 >> 0x20);
      magn[10] = fStack_3270;
      magn[0xb] = fStack_326c;
      fStack_321c = local_330c;
      fStack_3218 = fStack_3308;
      local_3248._0_8_ = filename._M_dataplus._M_p;
      local_3248._8_8_ = filename._M_string_length;
      local_3248._16_8_ = filename.field_2._M_allocated_capacity;
      local_3248._24_8_ = filename.field_2._8_8_;
      fStack_3220 = fStack_3310;
      magn._0_8_ = local_3298;
      magn._8_8_ = afStack_3290;
      magn._16_8_ = local_3288;
      magn._24_8_ = afStack_3280;
      magn._32_8_ = local_3278;
      magn[0xc] = fStack_3268;
      magn._52_8_ = afStack_3264._0_8_;
      operator*((SymmSH<15> *)a,1.0 - (fVar17 - (float)(int)fVar17),(SymmSH<15> *)local_3248);
      operator*((SymmSH<15> *)b,fVar17 - (float)(int)fVar17,(SymmSH<15> *)magn);
      operator+((SymmSH<15> *)a,(SymmSH<15> *)b);
    }
    std::_Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>::~_Vector_base(&local_32b0);
    w = normalized(&local_3348);
    SymmSH<15>::rotated((SH<15> *)b,&symmlog,w);
    operator+((SH<15> *)a,__return_storage_ptr__,(SH<15> *)b);
    memcpy(__return_storage_ptr__,(SH<15> *)a,900);
  }
  return __return_storage_ptr__;
}

Assistant:

SH<shorder> log_visibility(vec3f cluster_center, std::vector<Sphere> blockers)
{
	static int init = loadlut_cpu();
	SH<shorder> f;
	for (Sphere sph: blockers)
	{
        vec3f v = sph.center - cluster_center;
        float angle = asin(std::min(sph.radius / norm(v), 1.0f));
        SymmSH<shorder> symmlog = log_lookup(angle);
        f = f + symmlog.rotated(normalized(v));
	}
	return f;
}